

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bighexdump.cpp
# Opt level: O2

string * dumpstrings_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t len,size_t *usedlen)

{
  uchar *args;
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  char *__s;
  size_t sVar8;
  size_t sVar9;
  string escapecode;
  string escaped;
  string local_98;
  size_t *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = usedlen;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"\n\r\t",(allocator<char> *)&local_98);
  sVar8 = 0;
  bVar3 = false;
  uVar4 = 0;
  do {
    do {
      uVar6 = uVar4;
      sVar9 = len;
      if (len == sVar8) goto LAB_00114ccf;
      sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&local_70,buf[sVar8],0);
      bVar1 = buf[sVar8];
      args = buf + sVar8;
      iVar5 = isprint((uint)bVar1);
      if ((sVar7 != 0xffffffffffffffff || (bVar1 == 0x5c || bVar1 == 0x22)) || (iVar5 != 0)) {
        if (!bVar3) {
          if (__return_storage_ptr__->_M_string_length != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,",");
          }
          bVar3 = true;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"\"");
        }
        if (sVar7 != 0xffffffffffffffff || (bVar1 == 0x5c || bVar1 == 0x22)) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          local_98._M_string_length = 0;
          local_98.field_2._M_local_buf[0] = '\0';
          uVar2 = *args;
          if (uVar2 == '\t') {
            __s = "\\t";
LAB_00114c4a:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                      (&local_98,__s);
          }
          else {
            if (uVar2 == '\\') {
              __s = "\\\\";
              goto LAB_00114c4a;
            }
            __s = "\\r";
            if (uVar2 == '\r') goto LAB_00114c4a;
            if (uVar2 == '\"') {
              __s = "\\\"";
              goto LAB_00114c4a;
            }
            if (uVar2 == '\n') {
              __s = "\\n";
              goto LAB_00114c4a;
            }
            stringformat<unsigned_char_const&>(&local_50,"\\x%02x",args);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_98,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&local_98);
          goto LAB_00114c65;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,*args);
      }
      else {
        if (bVar3) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"\"");
          bVar3 = false;
        }
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,",");
        }
        stringformat<unsigned_char_const&>(&local_98,"%02x",args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_98);
LAB_00114c65:
        std::__cxx11::string::~string((string *)&local_98);
      }
      sVar8 = sVar8 + 1;
      uVar4 = uVar6;
    } while (len <= sVar8);
    if (sVar8 == 1) {
      if (*buf < 0xe) {
        uVar6 = 0x2401 >> (*buf & 0x1f);
      }
      else {
        uVar6 = 0;
      }
    }
  } while (((buf[sVar8] < 0xe) && (uVar4 = 1, (0x2401U >> (buf[sVar8] & 0x1f) & 1) != 0)) ||
          (sVar9 = sVar8, uVar4 = 0, (uVar6 & 1) == 0));
LAB_00114ccf:
  if (bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
  }
  *local_78 = sVar9;
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string dumpstrings(const uint8_t *buf, size_t len, size_t &usedlen)
{
    std::string result;
    bool bQuoted= false;
    bool bThisIsEolChar= false;
    std::string escaped= "\n\r\t";

    size_t i;
    for (i=0 ; i<len ; i++)
    {
        bool bNeedsEscape= escaped.find((char)buf[i])!=escaped.npos 
            || buf[i]=='\"' 
            || buf[i]=='\\';

        if (isprint(buf[i]) || bNeedsEscape) {
            if (!bQuoted) {
                if (!result.empty())
                    result += ",";
                result += "\"";
                bQuoted= true;
            }
            if (bNeedsEscape) {
                std::string escapecode;
                switch(buf[i]) {
                    case '\n': escapecode= "\\n"; break;
                    case '\r': escapecode= "\\r"; break;
                    case '\t': escapecode= "\\t"; break;
                    case '\"': escapecode= "\\\""; break;
                    case '\\': escapecode= "\\\\"; break;
                    default:
                       escapecode= stringformat("\\x%02x", buf[i]);
                }
                result += escapecode;
            }
            else {
                result += (char) buf[i];
            }
        }
        else {
            if (bQuoted) {
                result += "\"";
                bQuoted= false;
            }
            if (!result.empty())
                result += ",";
            result += stringformat("%02x", buf[i]);
        }
        if (i+1<len) {
            if (i==0)
                bThisIsEolChar = (buf[i]==0x0a || buf[i]==0x0d || buf[i]==0);

            bool bNextIsEolChar= (buf[i+1]==0x0a || buf[i+1]==0x0d || buf[i+1]==0);
            if (bThisIsEolChar && !bNextIsEolChar) {
                i++;
                break;
            }
            bThisIsEolChar= bNextIsEolChar;
        }
    }

    if (bQuoted) {
        result += "\"";
        bQuoted= false;
    }

    usedlen= i;

    return result;
}